

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::PrimToPrimSpec(Prim *prim,PrimSpec *ps,string *err)

{
  Model *pMVar1;
  Model *p;
  long *plVar2;
  long *plVar3;
  string *err_00;
  long *plVar4;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pMVar1 = tinyusdz::value::Value::as<tinyusdz::Model>(&prim->_data,false);
  if (pMVar1 == (Model *)0x0) {
    if (err != (string *)0x0) {
      ::std::operator+(&local_48,"Unsupported/unimplemented Prim type: ",&prim->_prim_type_name);
      plVar2 = (long *)::std::__cxx11::string::append((char *)&local_48);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_58 = *plVar3;
        lStack_50 = plVar2[3];
        plVar4 = &local_58;
      }
      else {
        local_58 = *plVar3;
        plVar4 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)err,(ulong)plVar4);
      if (plVar4 != &local_58) {
        operator_delete(plVar4,local_58 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    p = tinyusdz::value::Value::as<tinyusdz::Model>(&prim->_data,false);
    PrimToPrimSpecImpl<tinyusdz::Model>(p,ps,err_00);
  }
  return pMVar1 != (Model *)0x0;
}

Assistant:

bool PrimToPrimSpec(const Prim &prim, PrimSpec &ps, std::string *err) {
#define TO_PRIMSPEC(__ty)                                   \
  if (prim.as<__ty>()) {                                    \
    return PrimToPrimSpecImpl(*(prim.as<__ty>()), ps, err); \
  } else

  TO_PRIMSPEC(Model) {
    if (err) {
      (*err) +=
          "Unsupported/unimplemented Prim type: " + prim.prim_type_name() +
          "\n";
    }
    return false;
  }

#undef TO_PRIMSPEC
}